

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UBool __thiscall icu_63::ICUServiceKey::isFallbackOf(ICUServiceKey *this,UnicodeString *id)

{
  UBool UVar1;
  
  UVar1 = UnicodeString::operator==(id,&this->_id);
  return UVar1;
}

Assistant:

UBool 
ICUServiceKey::isFallbackOf(const UnicodeString& id) const 
{
    return id == _id;
}